

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O2

RealType OpenMD::MoLocator::getAtomMass(string *at,ForceField *myFF)

{
  AtomType *this;
  ostream *poVar1;
  RealType RVar2;
  
  this = ForceField::getAtomType(myFF,at);
  if (this != (AtomType *)0x0) {
    RVar2 = AtomType::getMass(this);
    return RVar2;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Can not find AtomType: ");
  poVar1 = std::operator<<(poVar1,(string *)at);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0.0;
}

Assistant:

RealType MoLocator::getAtomMass(const std::string& at, ForceField* myFF) {
    RealType mass;
    AtomType* atomType = myFF->getAtomType(at);
    if (atomType != NULL) {
      mass = atomType->getMass();
    } else {
      mass = 0.0;
      std::cerr << "Can not find AtomType: " << at << std::endl;
    }
    return mass;
  }